

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerOpenSavepoint(Pager *pPager,int nSavepoint)

{
  int iVar1;
  PagerSavepoint *pPVar2;
  Bitvec *pBVar3;
  PagerSavepoint *aNew;
  int ii;
  int nCurrent;
  int rc;
  int nSavepoint_local;
  Pager *pPager_local;
  
  aNew._0_4_ = pPager->nSavepoint;
  if (((int)aNew < nSavepoint) && (pPager->useJournal != '\0')) {
    pPVar2 = (PagerSavepoint *)sqlite3Realloc(pPager->aSavepoint,nSavepoint * 0x30);
    if (pPVar2 == (PagerSavepoint *)0x0) {
      return 7;
    }
    memset(pPVar2 + (int)aNew,0,(long)(nSavepoint - (int)aNew) * 0x30);
    pPager->aSavepoint = pPVar2;
    for (; (int)aNew < nSavepoint; aNew._0_4_ = (int)aNew + 1) {
      pPVar2[(int)aNew].nOrig = pPager->dbSize;
      if ((pPager->jfd->pMethods == (sqlite3_io_methods *)0x0) || (pPager->journalOff < 1)) {
        pPVar2[(int)aNew].iOffset = (ulong)pPager->sectorSize;
      }
      else {
        pPVar2[(int)aNew].iOffset = pPager->journalOff;
      }
      pPVar2[(int)aNew].iSubRec = pPager->nSubRec;
      pBVar3 = sqlite3BitvecCreate(pPager->dbSize);
      pPVar2[(int)aNew].pInSavepoint = pBVar3;
      if (pPVar2[(int)aNew].pInSavepoint == (Bitvec *)0x0) {
        return 7;
      }
      iVar1 = pagerUseWal(pPager);
      if (iVar1 != 0) {
        sqlite3WalSavepoint(pPager->pWal,pPVar2[(int)aNew].aWalData);
      }
      pPager->nSavepoint = (int)aNew + 1;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerOpenSavepoint(Pager *pPager, int nSavepoint){
  int rc = SQLITE_OK;                       /* Return code */
  int nCurrent = pPager->nSavepoint;        /* Current number of savepoints */

  assert( pPager->eState>=PAGER_WRITER_LOCKED );
  assert( assert_pager_state(pPager) );

  if( nSavepoint>nCurrent && pPager->useJournal ){
    int ii;                                 /* Iterator variable */
    PagerSavepoint *aNew;                   /* New Pager.aSavepoint array */

    /* Grow the Pager.aSavepoint array using realloc(). Return SQLITE_NOMEM
    ** if the allocation fails. Otherwise, zero the new portion in case a 
    ** malloc failure occurs while populating it in the for(...) loop below.
    */
    aNew = (PagerSavepoint *)sqlite3Realloc(
        pPager->aSavepoint, sizeof(PagerSavepoint)*nSavepoint
    );
    if( !aNew ){
      return SQLITE_NOMEM;
    }
    memset(&aNew[nCurrent], 0, (nSavepoint-nCurrent) * sizeof(PagerSavepoint));
    pPager->aSavepoint = aNew;

    /* Populate the PagerSavepoint structures just allocated. */
    for(ii=nCurrent; ii<nSavepoint; ii++){
      aNew[ii].nOrig = pPager->dbSize;
      if( isOpen(pPager->jfd) && pPager->journalOff>0 ){
        aNew[ii].iOffset = pPager->journalOff;
      }else{
        aNew[ii].iOffset = JOURNAL_HDR_SZ(pPager);
      }
      aNew[ii].iSubRec = pPager->nSubRec;
      aNew[ii].pInSavepoint = sqlite3BitvecCreate(pPager->dbSize);
      if( !aNew[ii].pInSavepoint ){
        return SQLITE_NOMEM;
      }
      if( pagerUseWal(pPager) ){
        sqlite3WalSavepoint(pPager->pWal, aNew[ii].aWalData);
      }
      pPager->nSavepoint = ii+1;
    }
    assert( pPager->nSavepoint==nSavepoint );
    assertTruncateConstraint(pPager);
  }

  return rc;
}